

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void plutovg_blend(plutovg_canvas_t *canvas,plutovg_span_buffer_t *span_buffer)

{
  plutovg_gradient_paint_t *gradient_00;
  plutovg_texture_paint_t *texture;
  plutovg_gradient_paint_t *gradient;
  plutovg_solid_paint_t *solid;
  plutovg_paint_t *paint;
  plutovg_span_buffer_t *span_buffer_local;
  plutovg_canvas_t *canvas_local;
  
  if ((span_buffer->spans).size != 0) {
    if (canvas->state->paint == (plutovg_paint_t *)0x0) {
      plutovg_blend_color(canvas,&canvas->state->color,span_buffer);
    }
    else {
      gradient_00 = (plutovg_gradient_paint_t *)canvas->state->paint;
      if ((gradient_00->base).type == PLUTOVG_PAINT_TYPE_COLOR) {
        plutovg_blend_color(canvas,(plutovg_color_t *)&gradient_00->type,span_buffer);
      }
      else if ((gradient_00->base).type == PLUTOVG_PAINT_TYPE_GRADIENT) {
        plutovg_blend_gradient(canvas,gradient_00,span_buffer);
      }
      else {
        plutovg_blend_texture(canvas,(plutovg_texture_paint_t *)gradient_00,span_buffer);
      }
    }
  }
  return;
}

Assistant:

void plutovg_blend(plutovg_canvas_t* canvas, const plutovg_span_buffer_t* span_buffer)
{
    if(span_buffer->spans.size == 0)
        return;
    if(canvas->state->paint == NULL) {
        plutovg_blend_color(canvas, &canvas->state->color, span_buffer);
        return;
    }

    plutovg_paint_t* paint = canvas->state->paint;
    if(paint->type == PLUTOVG_PAINT_TYPE_COLOR) {
        plutovg_solid_paint_t* solid = (plutovg_solid_paint_t*)(paint);
        plutovg_blend_color(canvas, &solid->color, span_buffer);
    } else if(paint->type == PLUTOVG_PAINT_TYPE_GRADIENT) {
        plutovg_gradient_paint_t* gradient = (plutovg_gradient_paint_t*)(paint);
        plutovg_blend_gradient(canvas, gradient, span_buffer);
    } else {
        plutovg_texture_paint_t* texture = (plutovg_texture_paint_t*)(paint);
        plutovg_blend_texture(canvas, texture, span_buffer);
    }
}